

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O3

QJsonObject __thiscall QVariant::toJsonObject(QVariant *this)

{
  QCborContainerPrivate *pQVar1;
  QCborContainerPrivate *pQVar2;
  bool bVar3;
  QJsonObject *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QJsonObject>::metaType;
  local_28.d_ptr = (QMetaTypeInterface *)((ulong)in_RSI[3].o.d.ptr & 0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if (((ulong)in_RSI[3].o.d.ptr & 1) != 0) {
      pQVar1 = (in_RSI->o).d.ptr;
      in_RSI = (QJsonObject *)
               ((long)&(pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + (long)*(int *)&pQVar1->field_0x4);
    }
    QJsonObject::QJsonObject((QJsonObject *)this,in_RSI);
  }
  else {
    (this->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonObject::QJsonObject((QJsonObject *)this);
    pQVar1 = in_RSI[3].o.d.ptr;
    if (((ulong)pQVar1 & 1) != 0) {
      pQVar2 = (in_RSI->o).d.ptr;
      in_RSI = (QJsonObject *)
               ((long)&(pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.
                       super_QBasicAtomicInteger<int>._q_value + (long)*(int *)&pQVar2->field_0x4);
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)pQVar1 & 0xfffffffffffffffc),in_RSI,local_20,
                       this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
           (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonObject QVariant::toJsonObject() const
{
    return qvariant_cast<QJsonObject>(*this);
}